

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

Quat4f __thiscall Quat4f::normalized(Quat4f *this)

{
  Quat4f *in_RSI;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  Quat4f QVar1;
  Quat4f *this_local;
  Quat4f *q;
  
  Quat4f(this,in_RSI);
  normalize(this);
  QVar1.m_elements[2] = (float)(int)in_XMM1_Qa;
  QVar1.m_elements[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  QVar1.m_elements[0] = (float)(int)extraout_XMM0_Qa;
  QVar1.m_elements[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Quat4f)QVar1.m_elements;
}

Assistant:

Quat4f Quat4f::normalized() const
{
	Quat4f q( *this );
	q.normalize();
	return q;
}